

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O2

void av1_quantize_fp_32x32_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i local_e0;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  __m256i local_80 [2];
  
  init_qp(round_ptr,quant_ptr,dequant_ptr,1,local_80,&local_e0);
  auVar2 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar7 = vpabsw_avx2(auVar2);
  auVar11 = vpcmpgtw_avx2(auVar7,(undefined1  [32])local_80[0]);
  if ((((((((((((((((((((((((((((((((auVar11 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar11 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar11 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar11 >> 0x1f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar11 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar11 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar11 >> 0x37 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar11 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar11 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar11 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar11 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar11 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar11 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar11 >> 0x7f,0) == '\0') &&
                    (auVar11 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar11 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar11 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar11 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar11 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar11 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar11 >> 0xbf,0) == '\0') &&
            (auVar11 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar11 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar11 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar11 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar11 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar11 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar11 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar11[0x1f]) {
    auVar8 = ZEXT1664((undefined1  [16])0x0);
    auVar7 = auVar8._0_32_;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar7;
    *(undefined1 (*) [32])qcoeff_ptr = auVar7;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar7;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar7;
  }
  else {
    auVar7 = vpaddsw_avx2(auVar7,(undefined1  [32])local_e0);
    auVar7 = vpmulhuw_avx2(auVar7,local_c0);
    auVar10 = vpsignw_avx2(auVar7,auVar2);
    auVar11 = vpmullw_avx2(local_a0,auVar7);
    auVar11 = vpsrlw_avx2(auVar11,1);
    auVar2 = vpsignw_avx2(auVar11,auVar2);
    auVar11 = vpsraw_avx2(auVar10,0xf);
    auVar5 = vpunpcklwd_avx2(auVar10,auVar11);
    auVar11 = vpunpckhwd_avx2(auVar10,auVar11);
    *(undefined1 (*) [32])qcoeff_ptr = auVar5;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar11;
    auVar10 = vpsraw_avx2(auVar2,0xf);
    auVar11 = vpunpcklwd_avx2(auVar2,auVar10);
    auVar2 = vpunpckhwd_avx2(auVar2,auVar10);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar11;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar2;
    auVar2 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar7 = vpcmpgtw_avx2(auVar7,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar2 = vpsubw_avx2(auVar2,auVar7);
    auVar2 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar2);
    auVar7 = vpand_avx2(auVar7,auVar2);
    auVar8 = ZEXT3264(auVar7);
  }
  auVar7 = vpermq_avx2((undefined1  [32])local_e0,0xee);
  auVar2 = vpermq_avx2(local_c0,0xee);
  auVar11 = vpermq_avx2(local_a0,0xee);
  auVar10 = vpermq_avx2((undefined1  [32])local_80[0],0xee);
  do {
    lVar6 = 0;
    while( true ) {
      iscan_ptr = (int16_t *)((long)iscan_ptr + 0x20);
      if (n_coeffs < 0x11) {
        auVar1 = vpmaxsw_avx(auVar8._0_16_,auVar8._16_16_);
        auVar9._8_2_ = 0x7fff;
        auVar9._0_8_ = 0x7fff7fff7fff7fff;
        auVar9._10_2_ = 0x7fff;
        auVar9._12_2_ = 0x7fff;
        auVar9._14_2_ = 0x7fff;
        auVar1 = vpsubusw_avx(auVar9,auVar1);
        auVar1 = vphminposuw_avx(auVar1);
        *eob_ptr = auVar1._0_2_ ^ 0x7fff;
        return;
      }
      auVar3 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar6 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar6 + 0x60));
      auVar5 = vpabsw_avx2(auVar3);
      auVar13 = vpcmpgtw_avx2(auVar5,auVar10);
      auVar12 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar13 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar13 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar13 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar13 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar13 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar13 >> 0x2f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar13 >> 0x37 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar13 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar13 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar13 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar13 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar13 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar13 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0x7f,0) != '\0') ||
                        (auVar13 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar13 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar13 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar13 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar13 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar13 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0xbf,0) != '\0') ||
                (auVar13 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar13 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar13 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar13 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar13 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') break;
      ((undefined1 (*) [32])(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar6))[1] = auVar12;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar6) = auVar12;
      ((undefined1 (*) [32])(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar6))[1] = auVar12
      ;
      *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar6) = auVar12;
      lVar6 = lVar6 + 0x40;
      n_coeffs = n_coeffs + -0x10;
    }
    auVar5 = vpaddsw_avx2(auVar5,auVar7);
    auVar5 = vpmulhuw_avx2(auVar5,auVar2);
    auVar4 = vpsignw_avx2(auVar5,auVar3);
    auVar13 = vpmullw_avx2(auVar5,auVar11);
    auVar13 = vpsrlw_avx2(auVar13,1);
    auVar5 = vpcmpgtw_avx2(auVar5,auVar12);
    auVar3 = vpsignw_avx2(auVar13,auVar3);
    auVar13 = vpsraw_avx2(auVar4,0xf);
    auVar12 = vpunpcklwd_avx2(auVar4,auVar13);
    auVar13 = vpunpckhwd_avx2(auVar4,auVar13);
    qcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)qcoeff_ptr + 0x40) + lVar6);
    *(undefined1 (*) [32])qcoeff_ptr = auVar12;
    *(undefined1 (*) [32])((long)qcoeff_ptr + 0x20) = auVar13;
    auVar12 = vpsraw_avx2(auVar3,0xf);
    auVar13 = vpunpcklwd_avx2(auVar3,auVar12);
    auVar3 = vpunpckhwd_avx2(auVar3,auVar12);
    dqcoeff_ptr = (tran_low_t *)(*(undefined1 (*) [32])((long)dqcoeff_ptr + 0x40) + lVar6);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar13;
    *(undefined1 (*) [32])((long)dqcoeff_ptr + 0x20) = auVar3;
    auVar3 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar3 = vpsubw_avx2(auVar3,auVar5);
    auVar5 = vpand_avx2(auVar5,auVar3);
    auVar5 = vpmaxsw_avx2(auVar8._0_32_,auVar5);
    auVar8 = ZEXT3264(auVar5);
    n_coeffs = n_coeffs + -0x10;
    coeff_ptr = (tran_low_t *)((long)coeff_ptr + lVar6 + 0x40);
  } while( true );
}

Assistant:

void av1_quantize_fp_32x32_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 1;
  const unsigned int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                    &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_32x32(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                      &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}